

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O2

void __thiscall Solver::constructSolutionSteps(Solver *this,Board *board)

{
  vector<Board,_std::allocator<Board>_> *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  *this_01;
  _Base_ptr p_Var1;
  bool bVar2;
  mapped_type *__x;
  string lastReference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  std::__cxx11::string::string((string *)&bStack_48,(string *)&board->referrer);
  this_00 = &this->steps;
  std::vector<Board,_std::allocator<Board>_>::push_back(this_00,board);
  this_01 = &this->pastSteps;
  while( true ) {
    bVar2 = std::operator!=(&bStack_48,"");
    if (!bVar2) break;
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
          ::operator[](this_01,&bStack_48);
    std::vector<Board,_std::allocator<Board>_>::push_back(this_00,__x);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
    ::operator[](this_01,&bStack_48);
    std::__cxx11::string::_M_assign((string *)&bStack_48);
  }
  p_Var1 = (this->pastSteps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this->numberOfNodes = (this->pastSteps)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<Board,_std::allocator<Board>_>::push_back(this_00,(value_type *)(p_Var1 + 2));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  ::clear(&this_01->_M_t);
  std::__cxx11::string::~string((string *)&bStack_48);
  return;
}

Assistant:

void Solver::constructSolutionSteps(Board board) {

    // Process the solution board first.
    string lastReference = board.referrer;
    this->steps.push_back(board);

    // Construct the solution steps from the reference chain.
    while (lastReference != "") {
        this->steps.push_back(this->pastSteps[lastReference]);
        lastReference = this->pastSteps[lastReference].referrer;
    }

    // Get the number of steps taken to find the solution.
    this->numberOfNodes = this->pastSteps.size();

    // Push the initial state of the board to the vector.
    this->steps.push_back((this->pastSteps.begin())->second);

    // Remove the useless past steps.
    this->pastSteps.clear();

    return;
}